

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataIndex.cpp
# Opt level: O3

string * __thiscall
MinVR::VRDataIndex::_walkXML
          (string *__return_storage_ptr__,VRDataIndex *this,element *node,string *nameSpace)

{
  pointer pcVar1;
  string *psVar2;
  undefined1 auVar3 [8];
  undefined8 uVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  char *pcVar8;
  long *plVar9;
  attribute *paVar10;
  iterator iVar11;
  iterator iVar12;
  element *this_00;
  _List_node_base *p_Var13;
  VRError *this_01;
  size_type *psVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  char separator;
  VRDataIndex *this_02;
  VRCORETYPE_ID typeId;
  string valueString;
  VRAttributeList al;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string qualifiedName;
  VRContainer childNames;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  _Rb_tree_color local_1d4;
  undefined1 local_1d0 [8];
  VRDatumPtrRC *local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string *local_190;
  allocator<char> local_181;
  undefined1 local_180 [40];
  _Base_ptr local_158;
  iterator local_150;
  string local_148;
  string local_128;
  int local_104;
  undefined1 local_100 [16];
  undefined1 local_f0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Base_ptr local_c0 [2];
  undefined1 local_b0 [16];
  string local_a0;
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  local_128._M_string_length = 0;
  local_128.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_150._M_node = (_Base_ptr)this;
  pcVar8 = element::get_name(node);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,pcVar8,(allocator<char> *)local_1d0);
  plVar9 = (long *)std::__cxx11::string::replace
                             ((ulong)&local_1b0,0,(char *)0x0,(ulong)(nameSpace->_M_dataplus)._M_p);
  pcVar1 = local_180 + 0x10;
  psVar14 = (size_type *)(plVar9 + 2);
  if ((size_type *)*plVar9 == psVar14) {
    local_180._16_8_ = *psVar14;
    local_180._24_8_ = plVar9[3];
    local_180._0_8_ = pcVar1;
  }
  else {
    local_180._16_8_ = *psVar14;
    local_180._0_8_ = (size_type *)*plVar9;
  }
  local_180._8_8_ = plVar9[1];
  *plVar9 = (long)psVar14;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_128,(string *)local_180);
  if ((pointer)local_180._0_8_ != pcVar1) {
    operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,
                    CONCAT71(local_1b0.field_2._M_allocated_capacity._1_7_,
                             local_1b0.field_2._M_local_buf[0]) + 1);
  }
  element::get_value_abi_cxx11_((string *)local_180,node);
  uVar4 = local_180._8_8_;
  if ((pointer)local_180._0_8_ != pcVar1) {
    operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
  }
  if (uVar4 != 0) {
    paVar10 = element::get_attribute(node,"type");
    if (paVar10 != (attribute *)0x0) {
      paVar10 = element::get_attribute(node,"type");
      pcVar8 = attribute::get_value(paVar10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_180,pcVar8,(allocator<char> *)&local_1b0);
      iVar11 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRCORETYPE_ID>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRCORETYPE_ID>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRCORETYPE_ID>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRCORETYPE_ID>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRCORETYPE_ID>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MinVR::VRCORETYPE_ID>_>_>
                       *)VRDatum::typeMap_abi_cxx11_,(key_type *)local_180);
      if ((pointer)local_180._0_8_ != pcVar1) {
        operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
      }
      if (iVar11._M_node == (_Base_ptr)(VRDatum::typeMap_abi_cxx11_ + 8)) {
        this_01 = (VRError *)__cxa_allocate_exception(0xa8);
        paVar10 = element::get_attribute(node,"type");
        pcVar8 = attribute::get_value(paVar10);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,pcVar8,&local_181);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_180,"No known type called ",&local_1b0);
        local_1d0 = (undefined1  [8])&local_1c0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"");
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_148,
                   "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/config/VRDataIndex.cpp"
                   ,"");
        local_104 = 0x199;
        local_100._0_8_ = local_f0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_100,
                   "std::string MinVR::VRDataIndex::_walkXML(element *, std::string)","");
        VRError::VRError(this_01,(string *)local_180,(string *)local_1d0,&local_148,&local_104,
                         (string *)local_100);
        __cxa_throw(this_01,&VRError::typeinfo,VRError::~VRError);
      }
      local_1d4 = iVar11._M_node[2]._M_color;
      goto LAB_00123a57;
    }
    bVar5 = element::has_child(node);
    if (!bVar5) {
      this_02 = (VRDataIndex *)local_180;
      element::get_value_abi_cxx11_((string *)this_02,node);
      local_1d4 = _inferType(this_02,(string *)local_180);
      if ((pointer)local_180._0_8_ != pcVar1) {
        operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
      }
      goto LAB_00123a57;
    }
  }
  local_1d4 = 7;
LAB_00123a57:
  paVar10 = element::get_attribute(node,"linkNode");
  if (paVar10 != (attribute *)0x0) {
    *(undefined1 *)&local_150._M_node[4]._M_left = 1;
  }
  paVar10 = element::get_attribute(node,"linkContent");
  if (paVar10 != (attribute *)0x0) {
    *(undefined1 *)&local_150._M_node[4]._M_left = 1;
  }
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  local_1b0._M_string_length = 0;
  local_1b0.field_2._M_local_buf[0] = '\0';
  element::get_value_abi_cxx11_((string *)local_180,node);
  uVar4 = local_180._8_8_;
  if ((pointer)local_180._0_8_ != pcVar1) {
    operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
  }
  if (uVar4 == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_1b0,0,(char *)local_1b0._M_string_length,0x13cd5f);
  }
  else {
    element::get_value_abi_cxx11_((string *)local_180,node);
    std::__cxx11::string::operator=((string *)&local_1b0,(string *)local_180);
    if ((pointer)local_180._0_8_ != pcVar1) {
      operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
    }
    uVar6 = std::__cxx11::string::find_first_not_of((char *)&local_1b0,0x13cd5b,0);
    uVar7 = std::__cxx11::string::find_last_not_of((char *)&local_1b0,0x13cd5b,0xffffffffffffffff);
    if ((int)(uVar7 | uVar6) < 0) {
      std::__cxx11::string::_M_replace
                ((ulong)&local_1b0,0,(char *)local_1b0._M_string_length,0x13cd5f);
      local_1d4 = 7;
    }
    else {
      std::__cxx11::string::substr((ulong)local_180,(ulong)&local_1b0);
      std::__cxx11::string::operator=((string *)&local_1b0,(string *)local_180);
      if ((pointer)local_180._0_8_ != pcVar1) {
        operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
      }
    }
  }
  paVar10 = element::get_attribute(node,"separator");
  if (paVar10 == (attribute *)0x0) {
    separator = ',';
  }
  else {
    paVar10 = element::get_attribute(node,"separator");
    pcVar8 = attribute::get_value(paVar10);
    separator = *pcVar8;
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_b0 + 0x10),local_1b0._M_dataplus._M_p,
             (char *)(local_1b0._M_string_length + (long)local_1b0._M_dataplus._M_p));
  _processValue((string *)local_180,(VRDataIndex *)local_150._M_node,&local_128,&local_1d4,
                (string *)(local_b0 + 0x10),separator);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_180);
  if ((pointer)local_180._0_8_ != pcVar1) {
    operator_delete((void *)local_180._0_8_,local_180._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  element::get_attribute_map_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_180,node);
  local_1d0 = (undefined1  [8])&local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"type","");
  iVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_180,(key_type *)local_1d0);
  if (local_1d0 != (undefined1  [8])&local_1c0) {
    operator_delete((void *)local_1d0,local_1c0._M_allocated_capacity + 1);
  }
  if (iVar12._M_node != (_Base_ptr)(local_180 + 8)) {
    local_1d0 = (undefined1  [8])&local_1c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"type","");
    iVar12 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_180,(key_type *)local_1d0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_180,(const_iterator)iVar12._M_node);
    if (local_1d0 != (undefined1  [8])&local_1c0) {
      operator_delete((void *)local_1d0,local_1c0._M_allocated_capacity + 1);
    }
  }
  if (local_158 != (_Base_ptr)0x0) {
    local_c0[0] = (_Base_ptr)local_b0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"");
    _getDatum((VRDataIndex *)local_1d0,(string *)local_150._M_node,__return_storage_ptr__,
              SUB81(local_c0,0));
    auVar3 = local_1d0;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree(&local_60,
               (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_180);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(((_List_node_base *)((long)auVar3 + 0x30))->_M_next + 1),&local_60);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_60);
    VRDatumPtr::~VRDatumPtr((VRDatumPtr *)local_1d0);
    if (local_c0[0] != (_Base_ptr)local_b0) {
      operator_delete(local_c0[0],local_b0._0_8_ + 1);
    }
  }
  local_100._0_8_ = local_100;
  local_f0._0_8_ = 0;
  psVar2 = (string *)(local_f0 + 0x10);
  local_190 = __return_storage_ptr__;
  local_100._8_8_ = local_100._0_8_;
  while( true ) {
    this_00 = element::get_next_child(node);
    if (this_00 == (element *)0x0) break;
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_148,local_128._M_dataplus._M_p,
               local_128._M_dataplus._M_p + local_128._M_string_length);
    std::__cxx11::string::append((char *)&local_148);
    element::get_name(this_00);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_148);
    paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 == paVar15) {
      local_1c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_1c0._8_8_ = plVar9[3];
      local_1d0 = (undefined1  [8])&local_1c0;
    }
    else {
      local_1c0._M_allocated_capacity = paVar15->_M_allocated_capacity;
      local_1d0 = (undefined1  [8])*plVar9;
    }
    local_1c8 = (VRDatumPtrRC *)plVar9[1];
    *plVar9 = (long)paVar15;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    p_Var13 = (_List_node_base *)operator_new(0x30);
    p_Var13[1]._M_next = p_Var13 + 2;
    if (local_1d0 == (undefined1  [8])&local_1c0) {
      p_Var13[2]._M_next = (_List_node_base *)local_1c0._M_allocated_capacity;
      p_Var13[2]._M_prev = (_List_node_base *)local_1c0._8_8_;
    }
    else {
      p_Var13[1]._M_next = (_List_node_base *)local_1d0;
      p_Var13[2]._M_next = (_List_node_base *)local_1c0._M_allocated_capacity;
    }
    p_Var13[1]._M_prev = (_List_node_base *)local_1c8;
    local_1c8 = (VRDatumPtrRC *)0x0;
    local_1c0._M_allocated_capacity = local_1c0._M_allocated_capacity & 0xffffffffffffff00;
    local_1d0 = (undefined1  [8])&local_1c0;
    std::__detail::_List_node_base::_M_hook(p_Var13);
    local_f0._0_8_ = local_f0._0_8_ + 1;
    if (local_1d0 != (undefined1  [8])&local_1c0) {
      operator_delete((void *)local_1d0,local_1c0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    local_f0._16_8_ = &local_d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)psVar2,local_128._M_dataplus._M_p,
               local_128._M_dataplus._M_p + local_128._M_string_length);
    std::__cxx11::string::append((char *)psVar2);
    _walkXML(&local_80,(VRDataIndex *)local_150._M_node,this_00,psVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._16_8_ != &local_d0) {
      operator_delete((void *)local_f0._16_8_,local_d0._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_100);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,
                    CONCAT71(local_1b0.field_2._M_allocated_capacity._1_7_,
                             local_1b0.field_2._M_local_buf[0]) + 1);
  }
  psVar2 = local_190;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,
                    CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                             local_128.field_2._M_local_buf[0]) + 1);
  }
  return psVar2;
}

Assistant:

std::string VRDataIndex::_walkXML(element* node, std::string nameSpace) {
  // This method will return the name of the last top-level element in
  // the input XML.

  std::string qualifiedName;
  std::string out;

  qualifiedName = nameSpace + std::string(node->get_name());

  // What type is this node?
  VRCORETYPE_ID typeId;
  if (node->get_value().empty()) {
    // If the node has no value, we hope it's a container.
    typeId = VRCORETYPE_CONTAINER;

  } else if (node->get_attribute("type") == NULL) {

    if (node->has_child()) {

      typeId = VRCORETYPE_CONTAINER;
    } else {

      typeId = _inferType(std::string(node->get_value()));
    }

  } else {

    // Check to see if the type is one we can handle.
    VRDatum::VRTypeMap::iterator it =
      VRDatum::typeMap.find(std::string(node->get_attribute("type")->get_value()));

    if (it == VRDatum::typeMap.end()) {
      // If not, throw an error.
      VRERRORNOADV("No known type called " +
                   std::string(node->get_attribute("type")->get_value()));
    } else {
      // Otherwise, pass it along as the typeID.
      typeId = it->second;
    }
  }

  // Check to see if this is a link to anywhere.  If it is, signal
  // that we'll need the linking step after the deserialize.
  if (node->get_attribute("linkNode") != NULL) _linkNeeded = true;
  if (node->get_attribute("linkContent") != NULL) _linkNeeded = true;

  // Get a value for the node.
  std::string valueString;
  if (node->get_value().empty()) {

    valueString = "";

  } else {

    // Convert to a string for some minor editing.
    valueString = std::string(node->get_value());

    // Trim leading and trailing spaces, tabs, whatever.
    int firstChar = (int)valueString.find_first_not_of(" \t\r\n");
    int lastChar = (int)valueString.find_last_not_of(" \t\r\n");

    if ((firstChar >= 0) && (lastChar >= 0)) {

      valueString = valueString.substr(firstChar, (1 + lastChar - firstChar));

    } else {

      valueString = "";
      typeId = VRCORETYPE_CONTAINER;
    }
  }

  char separator;
  if (node->get_attribute("separator") == NULL) {

    separator = MINVRSEPARATOR;

  } else {

    separator = *(node->get_attribute("separator")->get_value());
  }

  out = _processValue(qualifiedName,
                     typeId,
                     valueString,
                     separator);

  // There should be a datum object entered for this by here.  So now
  // we can see if there are any attributes to add to the list.
  VRDatum::VRAttributeList al = node->get_attribute_map();
  if (al.find("type") != al.end()) al.erase(al.find("type"));
  if (al.size() > 0) {

    _getDatum(out)->setAttributeList(al);
  }

  // This loops through the node children, if there are any.
  VRContainer childNames;
  while (true) {

    // Pick the next child.
    element* child = node->get_next_child();
    if (child == NULL) {

      return out;
    }

    // Collect a child name on the container's child name list.
    childNames.push_back(qualifiedName + "/" + child->get_name());

    // And go walk its tree.
    _walkXML(child, qualifiedName + "/");
  }
}